

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O2

int run_test_timer_run_once(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  uv_timer_t timer_handle;
  
  puVar2 = uv_default_loop();
  iVar1 = uv_timer_init(puVar2,&timer_handle);
  if (iVar1 == 0) {
    iVar1 = uv_timer_start(&timer_handle,timer_run_once_timer_cb,0,0);
    if (iVar1 == 0) {
      puVar2 = uv_default_loop();
      iVar1 = uv_run(puVar2,UV_RUN_ONCE);
      if (iVar1 == 0) {
        if (timer_run_once_timer_cb_called == 1) {
          iVar1 = uv_timer_start(&timer_handle,timer_run_once_timer_cb,1,0);
          if (iVar1 == 0) {
            puVar2 = uv_default_loop();
            iVar1 = uv_run(puVar2,UV_RUN_ONCE);
            if (iVar1 == 0) {
              if (timer_run_once_timer_cb_called == 2) {
                uv_close((uv_handle_t *)&timer_handle,(uv_close_cb)0x0);
                puVar2 = uv_default_loop();
                iVar1 = uv_run(puVar2,UV_RUN_ONCE);
                if (iVar1 == 0) {
                  puVar2 = uv_default_loop();
                  close_loop(puVar2);
                  puVar2 = uv_default_loop();
                  iVar1 = uv_loop_close(puVar2);
                  if (iVar1 == 0) {
                    return 0;
                  }
                  pcVar4 = "0 == uv_loop_close(uv_default_loop())";
                  uVar3 = 0x122;
                }
                else {
                  pcVar4 = "0 == uv_run(uv_default_loop(), UV_RUN_ONCE)";
                  uVar3 = 0x120;
                }
              }
              else {
                pcVar4 = "2 == timer_run_once_timer_cb_called";
                uVar3 = 0x11d;
              }
            }
            else {
              pcVar4 = "0 == uv_run(uv_default_loop(), UV_RUN_ONCE)";
              uVar3 = 0x11c;
            }
          }
          else {
            pcVar4 = "0 == uv_timer_start(&timer_handle, timer_run_once_timer_cb, 1, 0)";
            uVar3 = 0x11b;
          }
        }
        else {
          pcVar4 = "1 == timer_run_once_timer_cb_called";
          uVar3 = 0x119;
        }
      }
      else {
        pcVar4 = "0 == uv_run(uv_default_loop(), UV_RUN_ONCE)";
        uVar3 = 0x118;
      }
    }
    else {
      pcVar4 = "0 == uv_timer_start(&timer_handle, timer_run_once_timer_cb, 0, 0)";
      uVar3 = 0x117;
    }
  }
  else {
    pcVar4 = "0 == uv_timer_init(uv_default_loop(), &timer_handle)";
    uVar3 = 0x116;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer.c"
          ,uVar3,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(timer_run_once) {
  uv_timer_t timer_handle;

  ASSERT(0 == uv_timer_init(uv_default_loop(), &timer_handle));
  ASSERT(0 == uv_timer_start(&timer_handle, timer_run_once_timer_cb, 0, 0));
  ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_ONCE));
  ASSERT(1 == timer_run_once_timer_cb_called);

  ASSERT(0 == uv_timer_start(&timer_handle, timer_run_once_timer_cb, 1, 0));
  ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_ONCE));
  ASSERT(2 == timer_run_once_timer_cb_called);

  uv_close((uv_handle_t*) &timer_handle, NULL);
  ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_ONCE));

  MAKE_VALGRIND_HAPPY();
  return 0;
}